

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeBuiltin
          (Interpreter *this,string *name,Params *params)

{
  unsigned_long uVar1;
  byte bVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  ulong uVar5;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  pointer heap;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Value VVar8;
  HeapClosure *local_60;
  AST *local_58;
  _Alloc_hider _Stack_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  size_t local_30;
  
  local_40._M_allocated_capacity = (size_type)&_Stack_50;
  local_58 = (AST *)0x0;
  _Stack_50._M_p = (pointer)0x0;
  local_48 = (_Base_ptr)0x0;
  local_30 = 0;
  local_40._8_8_ = local_40._M_allocated_capacity;
  VVar8._0_8_ = (HeapClosure *)operator_new(0x90);
  HeapClosure::HeapClosure
            (VVar8._0_8_,(BindingFrame *)&local_58,(HeapObject *)0x0,0,params,(AST *)0x0,name);
  heap = (pointer)&local_60;
  local_60 = VVar8._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,(value_type *)heap);
  bVar2 = (this->heap).lastMark;
  ((VVar8._0_8_)->super_HeapEntity).mark = bVar2;
  lVar4 = (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = lVar4 >> 3;
  (this->heap).numEntities = uVar5;
  if (((this->heap).gcTuneMinObjects < uVar5) &&
     (auVar6._8_4_ = (int)(lVar4 >> 0x23), auVar6._0_8_ = uVar5, auVar6._12_4_ = 0x45300000,
     uVar1 = (this->heap).lastNumEntities, auVar7._8_4_ = (int)(uVar1 >> 0x20), auVar7._0_8_ = uVar1
     , auVar7._12_4_ = 0x45300000,
     ((auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar6._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))) {
    Heap::markFrom((Heap *)(ulong)bVar2,(HeapEntity *)VVar8._0_8_);
    heap = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    Stack::mark((Stack *)(this->stack).stack.
                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start,(Heap *)heap);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      heap = (pointer)(this->scratch).v.h;
      Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(HeapEntity *)heap);
    }
    for (p_Var3 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      heap = *(pointer *)(*(long *)(p_Var3 + 3) + 0x40);
      if (heap != (pointer)0x0) {
        Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(HeapEntity *)heap);
      }
    }
    for (p_Var3 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      heap = *(pointer *)(p_Var3 + 2);
      Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(HeapEntity *)heap);
    }
    Heap::sweep(&this->heap);
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              *)local_48,(_Link_type)heap);
  VVar8.v.h = extraout_RDX.h;
  return VVar8;
}

Assistant:

Value makeBuiltin(const std::string &name, const HeapClosure::Params &params)
    {
        AST *body = nullptr;
        Value r;
        r.t = Value::FUNCTION;
        r.v.h = makeHeap<HeapClosure>(BindingFrame(), nullptr, 0, params, body, name);
        return r;
    }